

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_Expression_x_iutest_x_Comparison_Test::~iu_Expression_x_iutest_x_Comparison_Test
          (iu_Expression_x_iutest_x_Comparison_Test *this)

{
  iu_Expression_x_iutest_x_Comparison_Test *this_local;
  
  iutest::Test::~Test(&this->super_Test);
  return;
}

Assistant:

IUTEST(Expression, Comparison)
{
    IUTEST_EXPECT(true);
    IUTEST_EXPECT(f());
    IUTEST_EXPECT(f() == 42);
    IUTEST_EXPECT(f() != 41);
    IUTEST_EXPECT(f() <= 42);
    IUTEST_EXPECT(f() >= 42);
    IUTEST_EXPECT(f() <  50);
    IUTEST_EXPECT(f() >  40);
    IUTEST_EXPECT(f() &&  1);
    IUTEST_EXPECT(f() ||  0);
}